

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder_optimum_fast.c
# Opt level: O0

void lzma_lzma_optimum_fast
               (lzma_coder_conflict9 *coder,lzma_mf *mf,uint32_t *back_res,uint32_t *len_res)

{
  uint uVar1;
  uint32_t uVar2;
  uint8_t *puVar3;
  short *psVar4;
  bool bVar5;
  uint local_74;
  uint8_t *buf_back_1;
  uint32_t len_1;
  uint32_t new_dist;
  uint8_t *buf_back;
  uint32_t len;
  uint32_t matches_count;
  uint32_t len_main;
  uint32_t nice_len;
  uint32_t limit;
  uint32_t back_main;
  uint32_t rep_index;
  uint32_t rep_len;
  uint32_t i;
  uint32_t buf_avail;
  uint8_t *buf;
  uint32_t *len_res_local;
  uint32_t *back_res_local;
  lzma_mf *mf_local;
  lzma_coder_conflict9 *coder_local;
  
  back_main = 0;
  limit = 0;
  nice_len = 0;
  matches_count = mf->nice_len;
  buf = (uint8_t *)len_res;
  len_res_local = back_res;
  back_res_local = (uint32_t *)mf;
  mf_local = (lzma_mf *)coder;
  if (mf->read_ahead == 0) {
    len = lzma_mf_find(mf,(uint32_t *)((long)&buf_back + 4),coder->matches);
  }
  else {
    if (mf->read_ahead != 1) {
      __assert_fail("mf->read_ahead == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder_optimum_fast.c"
                    ,0x26,
                    "void lzma_lzma_optimum_fast(lzma_coder *restrict, lzma_mf *restrict, uint32_t *restrict, uint32_t *restrict)"
                   );
    }
    len = coder->longest_match_length;
    buf_back._4_4_ = coder->matches_count;
  }
  puVar3 = mf_ptr((lzma_mf *)back_res_local);
  _i = (short *)(puVar3 + -1);
  uVar2 = mf_avail((lzma_mf *)back_res_local);
  if (uVar2 + 1 < 0x111) {
    uVar2 = mf_avail((lzma_mf *)back_res_local);
    local_74 = uVar2 + 1;
  }
  else {
    local_74 = 0x111;
  }
  rep_len = local_74;
  if (local_74 < 2) {
    *len_res_local = 0xffffffff;
    buf[0] = '\x01';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
  }
  else {
    for (rep_index = 0; rep_index < 4; rep_index = rep_index + 1) {
      psVar4 = (short *)((long)_i + (-1 - (ulong)(&mf_local[6].offset)[rep_index]));
      if (*_i == *psVar4) {
        buf_back._0_4_ = 2;
        while( true ) {
          bVar5 = false;
          if ((uint)buf_back < local_74) {
            bVar5 = *(char *)((long)_i + (ulong)(uint)buf_back) ==
                    *(char *)((long)psVar4 + (ulong)(uint)buf_back);
          }
          if (!bVar5) break;
          buf_back._0_4_ = (uint)buf_back + 1;
        }
        if (matches_count <= (uint)buf_back) {
          *len_res_local = rep_index;
          *(uint *)buf = (uint)buf_back;
          mf_skip((lzma_mf *)back_res_local,(uint)buf_back - 1);
          return;
        }
        if (back_main < (uint)buf_back) {
          limit = rep_index;
          back_main = (uint)buf_back;
        }
      }
    }
    if (len < matches_count) {
      if (1 < len) {
        nice_len = (&mf_local[6].pending)[(ulong)(buf_back._4_4_ - 1) * 2];
        while( true ) {
          bVar5 = false;
          if (1 < buf_back._4_4_) {
            bVar5 = len == (&mf_local[6].write_pos)[(ulong)(buf_back._4_4_ - 2) * 2] + 1;
          }
          if ((!bVar5) || (nice_len >> 7 <= (&mf_local[6].pending)[(ulong)(buf_back._4_4_ - 2) * 2])
             ) break;
          len = (&mf_local[6].write_pos)[(ulong)(buf_back._4_4_ - 2) * 2];
          nice_len = (&mf_local[6].pending)[(ulong)(buf_back._4_4_ - 2) * 2];
          buf_back._4_4_ = buf_back._4_4_ - 1;
        }
        if ((len == 2) && (0x7f < nice_len)) {
          len = 1;
        }
      }
      if ((back_main < 2) ||
         (((back_main + 1 < len && ((back_main + 2 < len || (nice_len < 0x201)))) &&
          ((back_main + 3 < len || (nice_len < 0x8001)))))) {
        if ((len < 2) || (local_74 < 3)) {
          *len_res_local = 0xffffffff;
          buf[0] = '\x01';
          buf[1] = '\0';
          buf[2] = '\0';
          buf[3] = '\0';
        }
        else {
          uVar2 = lzma_mf_find((lzma_mf *)back_res_local,
                               (uint32_t *)((long)&mf_local[0x18].hash + 4),
                               (lzma_match *)&mf_local[6].write_pos);
          *(uint32_t *)&mf_local[0x18].son = uVar2;
          if ((*(uint *)&mf_local[0x18].son < 2) ||
             (((((uVar1 = (&mf_local[6].pending)
                          [(ulong)(*(int *)((long)&mf_local[0x18].hash + 4) - 1) * 2],
                 *(uint *)&mf_local[0x18].son < len || (nice_len <= uVar1)) &&
                ((*(int *)&mf_local[0x18].son != len + 1 || (nice_len < uVar1 >> 7)))) &&
               (*(uint *)&mf_local[0x18].son <= len + 1)) &&
              (((*(int *)&mf_local[0x18].son + 1U < len || (len < 3)) || (nice_len >> 7 <= uVar1))))
             )) {
            _i = (short *)((long)_i + 1);
            len_main = len - 1;
            for (rep_index = 0; rep_index < 4; rep_index = rep_index + 1) {
              psVar4 = (short *)((long)_i + (-1 - (ulong)(&mf_local[6].offset)[rep_index]));
              if (*_i == *psVar4) {
                buf_back_1._0_4_ = 2;
                while( true ) {
                  bVar5 = false;
                  if ((uint)buf_back_1 < len_main) {
                    bVar5 = *(char *)((long)_i + (ulong)(uint)buf_back_1) ==
                            *(char *)((long)psVar4 + (ulong)(uint)buf_back_1);
                  }
                  if (!bVar5) break;
                  buf_back_1._0_4_ = (uint)buf_back_1 + 1;
                }
                if (len_main <= (uint)buf_back_1) {
                  *len_res_local = 0xffffffff;
                  buf[0] = '\x01';
                  buf[1] = '\0';
                  buf[2] = '\0';
                  buf[3] = '\0';
                  return;
                }
              }
            }
            *len_res_local = nice_len + 4;
            *(uint32_t *)buf = len;
            mf_skip((lzma_mf *)back_res_local,len - 2);
          }
          else {
            *len_res_local = 0xffffffff;
            buf[0] = '\x01';
            buf[1] = '\0';
            buf[2] = '\0';
            buf[3] = '\0';
          }
        }
      }
      else {
        *len_res_local = limit;
        *(uint32_t *)buf = back_main;
        mf_skip((lzma_mf *)back_res_local,back_main - 1);
      }
    }
    else {
      *len_res_local = (&mf_local[6].pending)[(ulong)(buf_back._4_4_ - 1) * 2] + 4;
      *(uint32_t *)buf = len;
      mf_skip((lzma_mf *)back_res_local,len - 1);
    }
  }
  return;
}

Assistant:

extern void
lzma_lzma_optimum_fast(lzma_coder *LZMA_RESTRICT coder, lzma_mf *LZMA_RESTRICT mf,
		uint32_t *LZMA_RESTRICT back_res, uint32_t *LZMA_RESTRICT len_res)
{
	const uint8_t *buf;
	uint32_t buf_avail;
	uint32_t i;
	uint32_t rep_len = 0;
	uint32_t rep_index = 0;
	uint32_t back_main = 0;
	uint32_t limit;

	const uint32_t nice_len = mf->nice_len;

	uint32_t len_main;
	uint32_t matches_count;
	if (mf->read_ahead == 0) {
		len_main = mf_find(mf, &matches_count, coder->matches);
	} else {
		assert(mf->read_ahead == 1);
		len_main = coder->longest_match_length;
		matches_count = coder->matches_count;
	}

	buf = mf_ptr(mf) - 1;
	buf_avail = my_min(mf_avail(mf) + 1, MATCH_LEN_MAX);

	if (buf_avail < 2) {
		// There's not enough input left to encode a match.
		*back_res = UINT32_MAX;
		*len_res = 1;
		return;
	}

	// Look for repeated matches; scan the previous four match distances
	for (i = 0; i < REP_DISTANCES; ++i) {
		uint32_t len;

		// Pointer to the beginning of the match candidate
		const uint8_t *const buf_back = buf - coder->reps[i] - 1;

		// If the first two bytes (2 == MATCH_LEN_MIN) do not match,
		// this rep is not useful.
		if (not_equal_16(buf, buf_back))
			continue;

		// The first two bytes matched.
		// Calculate the length of the match.
		for (len = 2; len < buf_avail
				&& buf[len] == buf_back[len]; ++len) ;

		// If we have found a repeated match that is at least
		// nice_len long, return it immediately.
		if (len >= nice_len) {
			*back_res = i;
			*len_res = len;
			mf_skip(mf, len - 1);
			return;
		}

		if (len > rep_len) {
			rep_index = i;
			rep_len = len;
		}
	}

	// We didn't find a long enough repeated match. Encode it as a normal
	// match if the match length is at least nice_len.
	if (len_main >= nice_len) {
		*back_res = coder->matches[matches_count - 1].dist
				+ REP_DISTANCES;
		*len_res = len_main;
		mf_skip(mf, len_main - 1);
		return;
	}

	if (len_main >= 2) {
		back_main = coder->matches[matches_count - 1].dist;

		while (matches_count > 1 && len_main ==
				coder->matches[matches_count - 2].len + 1) {
			if (!change_pair(coder->matches[
						matches_count - 2].dist,
					back_main))
				break;

			--matches_count;
			len_main = coder->matches[matches_count - 1].len;
			back_main = coder->matches[matches_count - 1].dist;
		}

		if (len_main == 2 && back_main >= 0x80)
			len_main = 1;
	}

	if (rep_len >= 2) {
		if (rep_len + 1 >= len_main
				|| (rep_len + 2 >= len_main
					&& back_main > (UINT32_C(1) << 9))
				|| (rep_len + 3 >= len_main
					&& back_main > (UINT32_C(1) << 15))) {
			*back_res = rep_index;
			*len_res = rep_len;
			mf_skip(mf, rep_len - 1);
			return;
		}
	}

	if (len_main < 2 || buf_avail <= 2) {
		*back_res = UINT32_MAX;
		*len_res = 1;
		return;
	}

	// Get the matches for the next byte. If we find a better match,
	// the current byte is encoded as a literal.
	coder->longest_match_length = mf_find(mf,
			&coder->matches_count, coder->matches);

	if (coder->longest_match_length >= 2) {
		const uint32_t new_dist = coder->matches[
				coder->matches_count - 1].dist;

		if ((coder->longest_match_length >= len_main
					&& new_dist < back_main)
				|| (coder->longest_match_length == len_main + 1
					&& !change_pair(back_main, new_dist))
				|| (coder->longest_match_length > len_main + 1)
				|| (coder->longest_match_length + 1 >= len_main
					&& len_main >= 3
					&& change_pair(new_dist, back_main))) {
			*back_res = UINT32_MAX;
			*len_res = 1;
			return;
		}
	}

	// In contrast to LZMA SDK, dictionary could not have been moved
	// between mf_find() calls, thus it is safe to just increment
	// the old buf pointer instead of recalculating it with mf_ptr().
	++buf;

	limit = len_main - 1;

	for (i = 0; i < REP_DISTANCES; ++i) {
		uint32_t len;

		const uint8_t *const buf_back = buf - coder->reps[i] - 1;

		if (not_equal_16(buf, buf_back))
			continue;

		for (len = 2; len < limit
				&& buf[len] == buf_back[len]; ++len) ;

		if (len >= limit) {
			*back_res = UINT32_MAX;
			*len_res = 1;
			return;
		}
	}

	*back_res = back_main + REP_DISTANCES;
	*len_res = len_main;
	mf_skip(mf, len_main - 2);
	return;
}